

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arena.c
# Opt level: O3

void arena_copy_out_of_mem(qcc_context *_ctx)

{
  qcc_arena *arena;
  size_t sVar1;
  size_t sVar2;
  qcc_generator_ptr gen;
  qcc_uint qVar3;
  void *pvVar4;
  char *pcVar5;
  undefined8 uVar6;
  
  arena = qcc_rand_arena(_ctx);
  sVar1 = qcc_arena_memory_available(arena);
  qcc_context_register_param(_ctx,"%s: qcc_arena %zu bytes","arena",sVar1);
  sVar2 = qcc_arena_memory_available(arena);
  gen = qcc_gen_uint_greater_than(_ctx,4,sVar2);
  qVar3 = qcc_generate_uint(gen);
  qcc_context_register_param(_ctx,"%s: %lu","size",qVar3 & 0xffffffff);
  pvVar4 = qcc_arena_copy(arena,(void *)0xdeadbeefcafe,qVar3 & 0xffffffff);
  if (pvVar4 == (void *)0x0) {
    sVar2 = qcc_arena_memory_available(arena);
    if (sVar2 == sVar1) {
      return;
    }
    pcVar5 = "qcc_arena_memory_available(arena) == arena_size";
    uVar6 = 0x2f;
  }
  else {
    pcVar5 = "ptr == 0";
    uVar6 = 0x2e;
  }
  qcc_context_fail(_ctx,"Assertion \"%s\" failed in %s (%s, line %d)\n",pcVar5,
                   "arena_copy_out_of_mem",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_arena.c"
                   ,uVar6);
  return;
}

Assistant:

TEST(arena_copy_out_of_mem)
{
    GIVEN_ARENA(arena);
    GIVEN_UINT(size, greater_than, qcc_arena_memory_available(arena));
    void *data = (void *)0xDEADBEEFCAFE;

    void *ptr = qcc_arena_copy(arena, data, size);
    ASSERT(ptr == 0);
    ASSERT(qcc_arena_memory_available(arena) == arena_size);
}